

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree *
kj::StringTree::concat<kj::StringPtr>(StringTree *__return_storage_ptr__,StringPtr *params)

{
  size_t sVar1;
  StringPtr *pSVar2;
  char *pos;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_a8;
  _ *local_a0;
  undefined8 local_98;
  Array<kj::StringTree::Branch> local_90;
  size_t local_78;
  _ *local_70;
  undefined8 local_68;
  String local_60;
  size_t local_38;
  _ *local_30;
  undefined8 local_28;
  undefined1 local_19;
  StringPtr *local_18;
  StringPtr *params_local;
  StringTree *result;
  
  local_19 = 0;
  local_18 = params;
  params_local = (StringPtr *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_38 = StringPtr::size(local_18);
  local_30 = (_ *)&local_38;
  local_28 = 1;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1;
  sVar1 = kj::_::sum(local_30,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::StringPtr>(local_18);
  local_78 = flatSize<kj::StringPtr>(pSVar2);
  local_70 = (_ *)&local_78;
  local_68 = 1;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x1;
  sVar1 = kj::_::sum(local_70,nums_00);
  heapString(&local_60,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_60);
  String::~String(&local_60);
  pSVar2 = fwd<kj::StringPtr>(local_18);
  local_a8 = branchCount<kj::StringPtr>(pSVar2);
  local_a0 = (_ *)&local_a8;
  local_98 = 1;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x1;
  sVar1 = kj::_::sum(local_a0,nums_01);
  heapArray<kj::StringTree::Branch>(&local_90,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_90);
  Array<kj::StringTree::Branch>::~Array(&local_90);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::StringPtr>(local_18);
  fill<kj::StringPtr>(__return_storage_ptr__,pos,0,pSVar2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}